

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O0

void EV_StartLightGlowing(int tag,int upper,int lower,int tics)

{
  DSectorEffect *pDVar1;
  DGlow2 *this;
  sector_t_conflict *len;
  sector_t_conflict *sector;
  sector_t *sec;
  FSectorTagIterator it;
  int temp;
  int secnum;
  int tics_local;
  int lower_local;
  int upper_local;
  int tag_local;
  
  if (0 < tics) {
    secnum = lower;
    tics_local = upper;
    if (upper < lower) {
      it.searchtag = upper;
      secnum = upper;
      tics_local = lower;
    }
    len = (sector_t_conflict *)(ulong)(uint)tag;
    FSectorTagIterator::FSectorTagIterator((FSectorTagIterator *)&sec,tag);
    while (it.start = FSectorTagIterator::Next((FSectorTagIterator *)&sec), -1 < it.start) {
      sector = sectors + it.start;
      pDVar1 = TObjPtr::operator_cast_to_DSectorEffect_((TObjPtr *)&sector->lightingdata);
      if (pDVar1 == (DSectorEffect *)0x0) {
        this = (DGlow2 *)DObject::operator_new((DObject *)0x58,(size_t)len);
        DGlow2::DGlow2(this,(sector_t *)sector,tics_local,secnum,tics,false);
        len = sector;
      }
    }
  }
  return;
}

Assistant:

void EV_StartLightGlowing (int tag, int upper, int lower, int tics)
{
	int secnum;

	// If tics is non-positive, then we can't really do anything.
	if (tics <= 0)
	{
		return;
	}

	if (upper < lower)
	{
		int temp = upper;
		upper = lower;
		lower = temp;
	}

	FSectorTagIterator it(tag);
	while ((secnum = it.Next()) >= 0)
	{
		sector_t *sec = &sectors[secnum];
		if (sec->lightingdata)
			continue;
		
		new DGlow2 (sec, upper, lower, tics, false);
	}
}